

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-callback-stack.c
# Opt level: O3

void timer_cb(uv_timer_t *handle)

{
  int iVar1;
  char *in_RSI;
  
  if (handle == &timer) {
    uv_walk(timer.loop,walk_cb,magic_cookie);
    uv_close(&timer,0);
    return;
  }
  timer_cb_cold_1();
  if (in_RSI == magic_cookie) {
    if (handle == &timer) {
      seen_timer_handle = seen_timer_handle + 1;
      return;
    }
  }
  else {
    walk_cb_cold_1();
  }
  walk_cb_cold_2();
  iVar1 = uv_is_closing();
  if (iVar1 != 0) {
    return;
  }
  uv_close(handle,0);
  return;
}

Assistant:

static void timer_cb(uv_timer_t* handle) {
  ASSERT(handle == &timer);
  ASSERT(nested == 0 && "timer_cb must be called from a fresh stack");

  puts("Timeout complete. Now read data...");

  nested++;
  if (uv_read_start((uv_stream_t*)&client, alloc_cb, read_cb)) {
    FATAL("uv_read_start failed");
  }
  nested--;

  timer_cb_called++;

  uv_close((uv_handle_t*)handle, close_cb);
}